

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scd_pcm.c
# Opt level: O0

void SCD_PCM_MemBlockWrite(void *info,UINT32 offset,UINT32 length,UINT8 *data)

{
  pcm_chip_ *chip;
  UINT8 *data_local;
  UINT32 length_local;
  UINT32 offset_local;
  void *info_local;
  
  if (offset < *(uint *)((long)info + 0xf4)) {
    data_local._0_4_ = length;
    if (*(uint *)((long)info + 0xf4) < offset + length) {
      data_local._0_4_ = *(int *)((long)info + 0xf4) - offset;
    }
    memcpy((void *)(*(long *)((long)info + 0xf8) + (ulong)offset),data,(ulong)(UINT32)data_local);
  }
  return;
}

Assistant:

static void SCD_PCM_MemBlockWrite(void* info, UINT32 offset, UINT32 length, const UINT8* data)
{
	struct pcm_chip_ *chip = (struct pcm_chip_ *)info;
	
	// offset is absolute here
	if (offset >= chip->RAMSize)
		return;
	if (offset + length > chip->RAMSize)
		length = chip->RAMSize - offset;
	
	memcpy(chip->RAM + offset, data, length);
	
	return;
}